

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

void __thiscall
ThreadInternalAttr::ThreadInternalAttr(ThreadInternalAttr *this,string *n,ThreadFunc *fc)

{
  std::__cxx11::string::string((string *)this,(string *)n);
  std::function<void_()>::function(&this->func,fc);
  return;
}

Assistant:

ThreadInternalAttr(const std::string& n, const Thread::ThreadFunc& fc):
			name(n),
			func(fc)
	{

	}